

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test::testBody
          (TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  undefined8 uVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  double dVar6;
  double dVar7;
  SimpleString local_100;
  MockNamedValue local_f0;
  MockNamedValue local_a0;
  SimpleString local_50 [2];
  undefined8 local_30;
  double tolerance;
  double value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)&value,"paramName");
  tolerance = 1.2;
  local_30 = 0x3fc999999999999a;
  MockExpectedCall::withParameter
            (&((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall,
             (SimpleString *)&value,1.2,0.2);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(local_50,pMVar1,&value);
  pcVar4 = SimpleString::asCharString(local_50);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"double",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x115,pTVar5);
  SimpleString::~SimpleString(local_50);
  pUVar3 = UtestShell::getCurrent();
  dVar7 = tolerance;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_a0,pMVar1,&value);
  dVar6 = MockNamedValue::getDoubleValue(&local_a0);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (dVar7,dVar6,0,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x116,pTVar5);
  MockNamedValue::~MockNamedValue(&local_a0);
  pUVar3 = UtestShell::getCurrent();
  uVar2 = local_30;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_f0,pMVar1,&value);
  dVar7 = MockNamedValue::getDoubleTolerance(&local_f0);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (uVar2,dVar7,0,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x117,pTVar5);
  MockNamedValue::~MockNamedValue(&local_f0);
  pUVar3 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_100);
  pcVar4 = SimpleString::asCharString(&local_100);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"funcName -> double paramName: <1.2>",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x118);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString((SimpleString *)&value);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithDoubleParameterAndTolerance)
{
    const SimpleString paramName = "paramName";
    double value = 1.2;
    double tolerance = 0.2;
    call->withParameter(paramName, value, tolerance);
    STRCMP_EQUAL("double", call->getInputParameterType(paramName).asCharString());
    DOUBLES_EQUAL(value, call->getInputParameter(paramName).getDoubleValue(), 0.0);
    DOUBLES_EQUAL(tolerance, call->getInputParameter(paramName).getDoubleTolerance(), 0.0);
    STRCMP_CONTAINS("funcName -> double paramName: <1.2>", call->callToString().asCharString());
}